

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O3

void Abc_ShowFile(char *FileNameDot)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  char *__ptr;
  char *pcVar4;
  char FileNamePs [200];
  char CommandPs [1000];
  char CommandDot [1000];
  char acStack_8c8 [208];
  char local_7f8 [1008];
  char local_408 [1008];
  
  pcVar4 = acStack_8c8;
  pcVar2 = Abc_FrameReadFlag("dotwin");
  if (pcVar2 != (char *)0x0) {
    Abc_FrameReadFlag("dotwin");
  }
  pcVar2 = Abc_FrameReadFlag("dotunix");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "dot";
  }
  else {
    pcVar2 = Abc_FrameReadFlag("dotunix");
  }
  pFVar3 = fopen(FileNameDot,"r");
  if (pFVar3 != (FILE *)0x0) {
    fclose(pFVar3);
    __ptr = Extra_FileNameGeneric(FileNameDot);
    sprintf(acStack_8c8,"%s.ps",__ptr);
    if (__ptr != (char *)0x0) {
      free(__ptr);
    }
    sprintf(local_408,"%s -Tps -o %s %s",pcVar2,acStack_8c8,FileNameDot);
    iVar1 = system(local_408);
    if (iVar1 == -1) {
      pcVar2 = "Command \"%s\" did not succeed.\n";
      pcVar4 = local_408;
    }
    else {
      pFVar3 = fopen(acStack_8c8,"r");
      if (pFVar3 == (FILE *)0x0) {
        pcVar2 = "Cannot open intermediate file \"%s\".\n";
      }
      else {
        fclose(pFVar3);
        pcVar4 = Abc_FrameReadFlag("gsviewwin");
        if (pcVar4 != (char *)0x0) {
          Abc_FrameReadFlag("gsviewwin");
        }
        pcVar4 = Abc_FrameReadFlag("gsviewunix");
        if (pcVar4 == (char *)0x0) {
          pcVar4 = "gv";
        }
        else {
          pcVar4 = Abc_FrameReadFlag("gsviewunix");
        }
        unlink(FileNameDot);
        sprintf(local_7f8,"%s %s &",pcVar4,acStack_8c8);
        iVar1 = system(local_7f8);
        if (iVar1 != -1) {
          return;
        }
        pcVar2 = "Cannot execute \"%s\".\n";
        pcVar4 = local_7f8;
      }
    }
    fprintf(_stdout,pcVar2,pcVar4);
    return;
  }
  fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",FileNameDot);
  return;
}

Assistant:

void Abc_ShowFile( char * FileNameDot )
{
    FILE * pFile;
    char * FileGeneric;
    char FileNamePs[200];
    char CommandDot[1000];
    char * pDotName;
    char * pDotNameWin = "dot.exe";
    char * pDotNameUnix = "dot";
    char * pGsNameWin = "gsview32.exe";
    char * pGsNameUnix = "gv";
    int RetValue;

    // get DOT names from the resource file
    if ( Abc_FrameReadFlag("dotwin") )
        pDotNameWin = Abc_FrameReadFlag("dotwin");
    if ( Abc_FrameReadFlag("dotunix") )
        pDotNameUnix = Abc_FrameReadFlag("dotunix");

#ifdef WIN32
    pDotName = pDotNameWin;
#else
    pDotName = pDotNameUnix;
#endif

    // check if the input DOT file is okay
    if ( (pFile = fopen( FileNameDot, "r" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );

    // create the PostScript file name
    FileGeneric = Extra_FileNameGeneric( FileNameDot );
    sprintf( FileNamePs,  "%s.ps",  FileGeneric ); 
    ABC_FREE( FileGeneric );

    // generate the PostScript file using DOT
    sprintf( CommandDot,  "%s -Tps -o %s %s", pDotName, FileNamePs, FileNameDot ); 
    RetValue = system( CommandDot );
    if ( RetValue == -1 )
    {
        fprintf( stdout, "Command \"%s\" did not succeed.\n", CommandDot );
        return;
    }
    // check that the input PostScript file is okay
    if ( (pFile = fopen( FileNamePs, "r" )) == NULL )
    {
        fprintf( stdout, "Cannot open intermediate file \"%s\".\n", FileNamePs );
        return;
    }
    fclose( pFile ); 


    // get GSVIEW names from the resource file
    if ( Abc_FrameReadFlag("gsviewwin") )
        pGsNameWin = Abc_FrameReadFlag("gsviewwin");
    if ( Abc_FrameReadFlag("gsviewunix") )
        pGsNameUnix = Abc_FrameReadFlag("gsviewunix");

    // spawn the viewer
#ifdef WIN32
    _unlink( FileNameDot );
    if ( _spawnl( _P_NOWAIT, pGsNameWin, pGsNameWin, FileNamePs, NULL ) == -1 )
        if ( _spawnl( _P_NOWAIT, "C:\\Program Files\\Ghostgum\\gsview\\gsview32.exe", 
            "C:\\Program Files\\Ghostgum\\gsview\\gsview32.exe", FileNamePs, NULL ) == -1 )
			if ( _spawnl( _P_NOWAIT, "C:\\Program Files\\Ghostgum\\gsview\\gsview64.exe", 
				"C:\\Program Files\\Ghostgum\\gsview\\gsview64.exe", FileNamePs, NULL ) == -1 )
			{
				fprintf( stdout, "Cannot find \"%s\".\n", pGsNameWin );
				return;
			}
#else
    {
        char CommandPs[1000];
        unlink( FileNameDot );
        sprintf( CommandPs,  "%s %s &", pGsNameUnix, FileNamePs ); 
        if ( system( CommandPs ) == -1 )
        {
            fprintf( stdout, "Cannot execute \"%s\".\n", CommandPs );
            return;
        }
    }
#endif
}